

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O0

void CESkyCoord::Observed2CIRS
               (CESkyCoord *in_observed,CESkyCoord *out_cirs,CEDate *date,CEObserver *observer)

{
  int iVar1;
  CEObserver *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  CEAngle CVar10;
  int err_code;
  double dec;
  double ra;
  undefined8 in_stack_fffffffffffffda0;
  CEDateType date_format;
  double in_stack_fffffffffffffda8;
  CEDate *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdc8;
  allocator *paVar11;
  undefined4 local_184;
  undefined1 local_180 [16];
  undefined1 local_170 [16];
  undefined6 in_stack_fffffffffffffea0;
  undefined1 uVar12;
  allocator in_stack_fffffffffffffea7;
  int *in_stack_fffffffffffffea8;
  string *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  sofa_error *in_stack_fffffffffffffec0;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  undefined1 local_e8 [64];
  CEAngle local_a8 [2];
  undefined1 local_88 [64];
  CEAngle local_48;
  int local_34;
  undefined8 local_30;
  undefined8 local_28;
  CEObserver *local_20;
  long *local_18;
  long *local_10;
  long *local_8;
  
  date_format = (CEDateType)((ulong)in_stack_fffffffffffffda0 >> 0x20);
  local_28 = 0;
  local_30 = 0;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,date_format);
  (**(code **)(*in_RDI + 0x18))(&local_48,in_RDI,local_88);
  dVar2 = CEAngle::Rad(&local_48);
  CppEphem::julian_date_J2000();
  CEDate::CEDate(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,date_format);
  (**(code **)(*local_8 + 0x20))(local_a8,local_8,local_e8);
  dVar3 = CEAngle::Rad(local_a8);
  dVar4 = CEDate::GetMJD2JDFactor();
  uVar5 = (**(code **)(*local_18 + 0x28))();
  dVar6 = CEDate::dut1((CEDate *)0x144844);
  dVar7 = CEObserver::Longitude_Rad(local_20);
  dVar8 = CEObserver::Latitude_Rad(local_20);
  dVar9 = CEObserver::Elevation_m(local_20);
  CEDate::xpolar((CEDate *)0x1448a4);
  CEDate::ypolar((CEDate *)0x1448bc);
  CEObserver::Pressure_hPa(local_20);
  CEObserver::Temperature_C(local_20);
  CEObserver::RelativeHumidity(local_20);
  CEObserver::Wavelength_um(local_20);
  iVar1 = iauAtoi13(dVar2,dVar3,dVar4,uVar5,dVar6,dVar7,dVar8,dVar9,"A",&local_28,&local_30);
  CEAngle::~CEAngle((CEAngle *)0x1449e8);
  CEDate::~CEDate((CEDate *)0x1449f5);
  CEAngle::~CEAngle((CEAngle *)0x144a02);
  CEDate::~CEDate((CEDate *)0x144a0f);
  local_34 = iVar1;
  if (iVar1 == -1) {
    uVar12 = 1;
    uVar5 = __cxa_allocate_exception(0xa8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_108,"CESkyCoord::CIRS2Observed",&local_109);
    paVar11 = &local_131;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_130,"iauAtio13",paVar11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffea8,"SOFA method was passed an unacceptable date",
               (allocator *)&stack0xfffffffffffffea7);
    CEException::sofa_error::sofa_error
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,
               (string *)
               CONCAT17(in_stack_fffffffffffffea7,CONCAT16(uVar12,in_stack_fffffffffffffea0)));
    __cxa_throw(uVar5,&CEException::sofa_error::typeinfo,CEException::sofa_error::~sofa_error);
  }
  CEAngle::Rad(in_stack_fffffffffffffdc8);
  CVar10 = CEAngle::Rad(in_stack_fffffffffffffdc8);
  local_184 = 0;
  (**(code **)(*local_10 + 0x28))(CVar10.angle_,local_10,local_170,local_180,&local_184);
  CEAngle::~CEAngle((CEAngle *)0x144cec);
  CEAngle::~CEAngle((CEAngle *)0x144cf9);
  return;
}

Assistant:

void CESkyCoord::Observed2CIRS(const CESkyCoord& in_observed,
                               CESkyCoord*       out_cirs,
                               const CEDate&     date,
                               const CEObserver& observer)
{
    // Preliminary coordinates
    double ra(0.0);
    double dec(0.0);

    // Run the SOFA method
    int err_code = iauAtoi13("A", 
                             in_observed.XCoord().Rad(), 
                             in_observed.YCoord().Rad(),
                             CEDate::GetMJD2JDFactor(), date.MJD(),
                             date.dut1(),
                             observer.Longitude_Rad(), 
                             observer.Latitude_Rad(),
                             observer.Elevation_m(),
                             date.xpolar(), date.ypolar(),
                             observer.Pressure_hPa(),
                             observer.Temperature_C(),
                             observer.RelativeHumidity(),
                             observer.Wavelength_um(),
                             &ra, &dec);

    // Handle unacceptable date
    if (err_code == -1) {
        throw CEException::sofa_error("CESkyCoord::CIRS2Observed",
                                      "iauAtio13", -1,
                                      "SOFA method was passed an unacceptable date");
    }

    // Set ICRS coordinates
    out_cirs->SetCoordinates(CEAngle::Rad(ra), CEAngle::Rad(dec),
                             CESkyCoordType::CIRS);

    return;
}